

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_hello_select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  int iVar1;
  ushort *puVar2;
  ulong uVar3;
  ushort *puVar4;
  int iVar5;
  ptls_key_exchange_algorithm_t *ppVar6;
  ptls_key_exchange_algorithm_t **pppVar7;
  
  iVar1 = 0x32;
  if (1 < (ulong)((long)end - (long)src)) {
    uVar3 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    puVar2 = (ushort *)(src + 2);
    if (uVar3 <= (ulong)((long)end - (long)puVar2)) {
      puVar4 = (ushort *)(uVar3 + (long)puVar2);
      do {
        if ((long)puVar4 - (long)puVar2 < 2) {
          return 0x32;
        }
        iVar5 = 0;
        if (*selected == (ptls_key_exchange_algorithm_t *)0x0) {
          ppVar6 = *candidates;
          if (ppVar6 != (ptls_key_exchange_algorithm_t *)0x0) {
            pppVar7 = candidates + 1;
            do {
              if (ppVar6->id == (uint16_t)(*puVar2 << 8 | *puVar2 >> 8)) {
                *selected = ppVar6;
                iVar5 = 0;
                goto LAB_00110dcb;
              }
              ppVar6 = *pppVar7;
              pppVar7 = pppVar7 + 1;
            } while (ppVar6 != (ptls_key_exchange_algorithm_t *)0x0);
          }
          iVar5 = 0x28;
        }
LAB_00110dcb:
        puVar2 = puVar2 + 1;
      } while (puVar2 != puVar4);
      iVar1 = 0x32;
      if (puVar4 == (ushort *)end) {
        iVar1 = iVar5;
      }
    }
  }
  return iVar1;
}

Assistant:

static int client_hello_select_negotiated_group(ptls_key_exchange_algorithm_t **selected,
                                                ptls_key_exchange_algorithm_t **candidates, const uint8_t *src, const uint8_t *end)
{
    int ret;

    decode_block(src, end, 2, {
        do {
            uint16_t id;
            if ((ret = decode16(&id, &src, end)) != 0)
                goto Exit;
            if (*selected == NULL) {
                ptls_key_exchange_algorithm_t **c = candidates;
                for (; *c != NULL; ++c) {
                    if ((*c)->id == id) {
                        *selected = *c;
                        break;
                    }
                }
            }
        } while (src != end);
    });
    ret = *selected != NULL ? 0 : PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}